

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

AtanhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_atanh(NeuralNetworkLayer *this)

{
  bool bVar1;
  AtanhLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_atanh(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_atanh(this);
    this_00 = (AtanhLayerParams *)operator_new(0x18);
    AtanhLayerParams::AtanhLayerParams(this_00);
    (this->layer_).atanh_ = this_00;
  }
  return (AtanhLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::AtanhLayerParams* NeuralNetworkLayer::mutable_atanh() {
  if (!has_atanh()) {
    clear_layer();
    set_has_atanh();
    layer_.atanh_ = new ::CoreML::Specification::AtanhLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.atanh)
  return layer_.atanh_;
}